

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::
reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
             conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<int>_conflict1 transaction;
  reentrant_put_transaction<int> local_68;
  reentrant_put_transaction<int> local_50;
  reentrant_put_transaction<int> local_38;
  
  local_50.m_put_data =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  i_queue);
  local_50.m_put_data.m_control_block[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_50.m_put_data.m_user_storage = 1;
  local_50.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_38.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)i_queue;
  local_38.m_put_data = local_50.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_50);
  local_50.m_queue = local_38.m_queue;
  local_38.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_50.m_put_data = local_38.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_38);
  local_68.m_queue = local_50.m_queue;
  local_50.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_68.m_put_data = local_50.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_50);
  exception_checkpoint();
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)local_68.m_queue;
  (__return_storage_ptr__->m_put_data).m_control_block = local_68.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_data).m_user_storage = local_68.m_put_data.m_user_storage;
  local_68.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(1);
                exception_checkpoint();
                return std::move(transaction);
            }